

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QWellArray::paintEvent(QWellArray *this,QPaintEvent *e)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  LayoutDirection LVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long in_FS_OFFSET;
  QPainter painter;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = *(int *)(e + 0x10);
  iVar14 = *(int *)(e + 0x14);
  iVar8 = *(int *)(e + 0x18);
  iVar9 = *(int *)(e + 0x1c);
  LVar6 = QWidget::layoutDirection(&this->super_QWidget);
  if (LVar6 == RightToLeft) {
    uVar11 = ~(iVar10 / this->cellw) + this->ncols;
  }
  else {
    uVar11 = iVar10 / this->cellw;
  }
  LVar6 = QWidget::layoutDirection(&this->super_QWidget);
  if (LVar6 == RightToLeft) {
    uVar13 = ~((iVar8 + 1) / this->cellw) + this->ncols;
  }
  else {
    uVar13 = (iVar8 + 1) / this->cellw;
  }
  uVar3 = (long)iVar14 / (long)this->cellh;
  uVar12 = uVar3 & 0xffffffff;
  iVar10 = (iVar9 + 1) / this->cellh;
  LVar6 = QWidget::layoutDirection(&this->super_QWidget);
  uVar7 = uVar11;
  if (LVar6 == RightToLeft) {
    uVar7 = uVar13;
  }
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_40,&(this->super_QWidget).super_QPaintDevice);
  local_58 = 0;
  iStack_54 = 0;
  uVar1 = this->cellw;
  uVar2 = this->cellh;
  iStack_50 = uVar1 + -1;
  iStack_4c = uVar2 + -1;
  iVar14 = this->nrows + -1;
  iVar8 = iVar14;
  if (iVar10 < this->nrows) {
    iVar8 = iVar10;
  }
  if (iVar10 < 0) {
    iVar8 = iVar14;
  }
  if ((int)uVar3 <= iVar8) {
    if (LVar6 == RightToLeft) {
      uVar13 = uVar11;
    }
    uVar11 = this->ncols - 1;
    uVar4 = uVar11;
    if ((int)uVar13 < this->ncols) {
      uVar4 = uVar13;
    }
    if ((int)uVar13 < 0) {
      uVar4 = uVar11;
    }
    do {
      iVar10 = (int)uVar12;
      if ((int)uVar7 <= (int)uVar4) {
        iVar14 = this->cellh * iVar10;
        uVar11 = ~uVar7;
        uVar13 = uVar7;
        do {
          LVar6 = QWidget::layoutDirection(&this->super_QWidget);
          uVar5 = uVar13;
          if (LVar6 == RightToLeft) {
            uVar5 = this->ncols + uVar11;
          }
          iVar9 = uVar5 * this->cellw;
          local_58 = local_58 + iVar9;
          iStack_54 = iStack_54 + iVar14;
          iStack_50 = iStack_50 + iVar9;
          iStack_4c = iStack_4c + iVar14;
          (**(code **)(*(long *)&this->super_QWidget + 0x1b0))
                    (this,&local_40,uVar12,uVar13,&local_58);
          local_58 = local_58 - iVar9;
          iStack_54 = iStack_54 - iVar14;
          iStack_50 = iStack_50 - iVar9;
          iStack_4c = iStack_4c - iVar14;
          uVar13 = uVar13 + 1;
          uVar11 = uVar11 - 1;
        } while (uVar4 + 1 != uVar13);
      }
      uVar12 = (ulong)(iVar10 + 1);
    } while (iVar10 != iVar8);
  }
  QPainter::~QPainter((QPainter *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWellArray::paintEvent(QPaintEvent *e)
{
    QRect r = e->rect();
    int cx = r.x();
    int cy = r.y();
    int ch = r.height();
    int cw = r.width();
    int colfirst = columnAt(cx);
    int collast = columnAt(cx + cw);
    int rowfirst = rowAt(cy);
    int rowlast = rowAt(cy + ch);

    if (isRightToLeft()) {
        int t = colfirst;
        colfirst = collast;
        collast = t;
    }

    QPainter painter(this);
    QPainter *p = &painter;
    QRect rect(0, 0, cellWidth(), cellHeight());


    if (collast < 0 || collast >= ncols)
        collast = ncols-1;
    if (rowlast < 0 || rowlast >= nrows)
        rowlast = nrows-1;

    // Go through the rows
    for (int r = rowfirst; r <= rowlast; ++r) {
        // get row position and height
        int rowp = rowY(r);

        // Go through the columns in the row r
        // if we know from where to where, go through [colfirst, collast],
        // else go through all of them
        for (int c = colfirst; c <= collast; ++c) {
            // get position and width of column c
            int colp = columnX(c);
            // Translate painter and draw the cell
            rect.translate(colp, rowp);
            paintCell(p, r, c, rect);
            rect.translate(-colp, -rowp);
        }
    }
}